

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

StringRef llvm::dwarf::UnitTypeString(uint UT)

{
  char *pcVar1;
  size_t sVar2;
  uint uVar3;
  StringRef SVar4;
  
  uVar3 = UT - 1;
  pcVar1 = (char *)0x0;
  sVar2 = 0;
  if (uVar3 < 6) {
    pcVar1 = &DAT_00e6fc90 + *(int *)(&DAT_00e6fc90 + (ulong)uVar3 * 4);
    sVar2 = *(size_t *)(&DAT_00e6fca8 + (ulong)uVar3 * 8);
  }
  SVar4.Length = sVar2;
  SVar4.Data = pcVar1;
  return SVar4;
}

Assistant:

StringRef llvm::dwarf::UnitTypeString(unsigned UT) {
  switch (UT) {
  default:
    return StringRef();
#define HANDLE_DW_UT(ID, NAME)                                                 \
  case DW_UT_##NAME:                                                           \
    return "DW_UT_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}